

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledImage.cpp
# Opt level: O2

void __thiscall
Rml::DecoratorTiledImageInstancer::DecoratorTiledImageInstancer(DecoratorTiledImageInstancer *this)

{
  allocator<char> local_52;
  allocator<char> local_51;
  String local_50;
  String local_30;
  
  DecoratorTiledInstancer::DecoratorTiledInstancer(&this->super_DecoratorTiledInstancer,1);
  (this->super_DecoratorTiledInstancer).super_DecoratorInstancer._vptr_DecoratorInstancer =
       (_func_int **)&PTR__DecoratorTiledImageInstancer_003973f8;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"image",(allocator<char> *)&local_30);
  DecoratorTiledInstancer::RegisterTileProperty(&this->super_DecoratorTiledInstancer,&local_50,true)
  ;
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"decorator",&local_51);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"image",&local_52);
  EffectSpecification::RegisterShorthand
            (&(this->super_DecoratorTiledInstancer).super_DecoratorInstancer.
              super_EffectSpecification,&local_50,&local_30,RecursiveRepeat);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

DecoratorTiledImageInstancer::DecoratorTiledImageInstancer() : DecoratorTiledInstancer(1)
{
	RegisterTileProperty("image", true);
	RegisterShorthand("decorator", "image", ShorthandType::RecursiveRepeat);
}